

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Vector<double,_4> * __thiscall
math::Matrix<double,_4,_4>::col
          (Vector<double,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *this,int index)

{
  Vector<double,_4> *pVVar1;
  long lVar2;
  
  pVVar1 = __return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
    __return_storage_ptr__->v[0] = *(undefined8 *)((long)this->m + lVar2 + (long)index * 8);
    __return_storage_ptr__ = (Vector<double,_4> *)((long)__return_storage_ptr__ + 8);
  }
  return pVVar1;
}

Assistant:

inline Vector<T,N>
Matrix<T,N,M>::col (int index) const
{
    typedef algo::InterleavedIter<T,M> RowIter;
    Vector<T,N> ret;
    std::copy(RowIter(m + index), RowIter(m + index + M * N), *ret);
    return ret;
}